

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_1::WatWriter::ExprVisitorDelegate::OnCallIndirectExpr
          (ExprVisitorDelegate *this,CallIndirectExpr *expr)

{
  WatWriter *this_00;
  char *pcVar1;
  int __c;
  
  this_00 = this->writer_;
  pcVar1 = Opcode::GetName((Opcode *)&Opcode::CallIndirect_Opcode);
  WritePutsSpace(this_00,pcVar1);
  if ((expr->table).type_ == Index) {
    pcVar1 = Var::index(&expr->table,pcVar1,__c);
    if ((int)pcVar1 == 0) goto LAB_001681d2;
  }
  WriteVar(this->writer_,&expr->table,Space);
LAB_001681d2:
  WriteOpenSpace(this->writer_,"type");
  WriteVar(this->writer_,&(expr->decl).type_var,Newline);
  WriteCloseNewline(this->writer_);
  return (Result)Ok;
}

Assistant:

Result WatWriter::ExprVisitorDelegate::OnCallIndirectExpr(
    CallIndirectExpr* expr) {
  writer_->WritePutsSpace(Opcode::CallIndirect_Opcode.GetName());
  if (!expr->table.is_index() || expr->table.index() != 0) {
    writer_->WriteVar(expr->table, NextChar::Space);
  }
  writer_->WriteOpenSpace("type");
  writer_->WriteVar(expr->decl.type_var, NextChar::Newline);
  writer_->WriteCloseNewline();
  return Result::Ok;
}